

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O0

bool __thiscall
flow::lang::CallableSym::tryMatch(CallableSym *this,ParamList *params,string *errorMessage)

{
  bool bVar1;
  LiteralType rt;
  ulong uVar2;
  size_t sVar3;
  Signature *pSVar4;
  vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  *pvVar8;
  const_reference this_00;
  pointer pEVar9;
  string *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Signature *in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  basic_string_view<char> local_2e0;
  string local_2d0;
  value_type local_2ac;
  reference local_2a8;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *arg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  *__range3;
  vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> argTypes;
  Signature sig;
  LiteralType type_1;
  string *name;
  basic_string_view<char> local_218;
  string local_208;
  DefaultValue *local_1e8;
  DefaultValue *defaultValue_1;
  size_t e_1;
  size_t i_2;
  basic_string_view<char> local_1c8;
  string local_1b8;
  value_type local_198;
  value_type local_194;
  LiteralType givenType;
  LiteralType expectedType;
  size_t e;
  size_t i_1;
  string local_170;
  undefined4 local_14c;
  basic_string_view<char> local_148;
  string local_138;
  reference local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string t;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  superfluous;
  undefined1 auStack_a8 [4];
  LiteralType type;
  char *local_a0;
  string local_98;
  DefaultValue *local_78;
  DefaultValue *defaultValue;
  string *paramName;
  int i;
  int argc;
  char *local_58;
  string local_50;
  NativeCallback *local_30;
  NativeCallback *native;
  string *errorMessage_local;
  ParamList *params_local;
  CallableSym *this_local;
  
  native = (NativeCallback *)errorMessage;
  errorMessage_local = (string *)params;
  params_local = (ParamList *)this;
  local_30 = nativeCallback(this);
  bVar1 = ParamList::empty((ParamList *)errorMessage_local);
  if (bVar1) {
    if (local_30 != (NativeCallback *)0x0) {
      pSVar4 = NativeCallback::signature(local_30);
      pvVar5 = Signature::args(pSVar4);
      bVar1 = std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::empty(pvVar5);
      if (!bVar1) goto LAB_001798c9;
    }
    this_local._7_1_ = 1;
  }
  else {
LAB_001798c9:
    bVar1 = ParamList::isNamed((ParamList *)errorMessage_local);
    if (bVar1) {
      bVar1 = NativeCallback::parametersNamed(local_30);
      if (bVar1) {
        pSVar4 = signature(this);
        pvVar5 = Signature::args(pSVar4);
        sVar6 = std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::size(pvVar5);
        paramName._4_4_ = (int)sVar6;
        for (paramName._0_4_ = 0; (int)paramName != paramName._4_4_;
            paramName._0_4_ = (int)paramName + 1) {
          defaultValue = (DefaultValue *)
                         NativeCallback::getParamNameAt_abi_cxx11_(local_30,(long)(int)paramName);
          bVar1 = ParamList::contains((ParamList *)errorMessage_local,(string *)defaultValue);
          if (!bVar1) {
            local_78 = NativeCallback::getDefaultParamAt_abi_cxx11_(local_30,(long)(int)paramName);
            bVar1 = std::
                    holds_alternative<std::monostate,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                              (local_78);
            if (bVar1) {
              fmt::v5::basic_string_view<char>::basic_string_view
                        ((basic_string_view<char> *)auStack_a8,
                         "Callee \"{}\" invoked without required named parameter \"{}\".");
              psVar10 = Symbol::name_abi_cxx11_(&this->super_Symbol);
              format_str_00.size_ = (size_t)psVar10;
              format_str_00.data_ = local_a0;
              fmt::v5::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_98,_auStack_a8,format_str_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         defaultValue,&in_R9->name_);
              std::__cxx11::string::operator=((string *)native,(string *)&local_98);
              std::__cxx11::string::~string((string *)&local_98);
              this_local._7_1_ = 0;
              goto LAB_0017a200;
            }
            pSVar4 = signature(this);
            pvVar5 = Signature::args(pSVar4);
            pvVar7 = std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::operator[]
                               (pvVar5,(long)(int)paramName);
            superfluous.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar7;
            completeDefaultValue
                      ((ParamList *)errorMessage_local,
                       superfluous.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_78,
                       (string *)defaultValue);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8);
        ParamList::reorder((ParamList *)errorMessage_local,local_30,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_c8);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c8);
        if (bVar1) {
          this_local._7_1_ = 1;
          local_14c = 1;
        }
        else {
          std::__cxx11::string::string((string *)&__range4);
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_c8);
          s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c8);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&s), bVar1) {
            local_118 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end4);
            uVar2 = std::__cxx11::string::empty();
            if ((uVar2 & 1) == 0) {
              std::__cxx11::string::operator+=((string *)&__range4,", ");
            }
            std::__cxx11::string::operator+=((string *)&__range4,"\"");
            std::__cxx11::string::operator+=((string *)&__range4,(string *)local_118);
            std::__cxx11::string::operator+=((string *)&__range4,"\"");
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          fmt::v5::basic_string_view<char>::basic_string_view
                    (&local_148,"Superfluous arguments passed to callee \"{}\": {}.");
          psVar10 = Symbol::name_abi_cxx11_(&this->super_Symbol);
          format_str_01.size_ = (size_t)psVar10;
          format_str_01.data_ = (char *)local_148.size_;
          fmt::v5::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_138,(v5 *)local_148.data_,format_str_01,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range4,
                     &in_R9->name_);
          std::__cxx11::string::operator=((string *)native,(string *)&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          this_local._7_1_ = 0;
          local_14c = 1;
          std::__cxx11::string::~string((string *)&__range4);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
      }
      else {
        fmt::v5::basic_string_view<char>::basic_string_view
                  ((basic_string_view<char> *)&i,
                   "Callee \"{}\" invoked with named parameters, but no names provided by runtime.")
        ;
        psVar10 = Symbol::name_abi_cxx11_(&this->super_Symbol);
        format_str.size_ = (size_t)psVar10;
        format_str.data_ = local_58;
        fmt::v5::format<std::__cxx11::string>(&local_50,_i,format_str,in_R8);
        std::__cxx11::string::operator=((string *)native,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        this_local._7_1_ = 0;
      }
    }
    else {
      sVar3 = ParamList::size((ParamList *)errorMessage_local);
      pSVar4 = signature(this);
      pvVar5 = Signature::args(pSVar4);
      sVar6 = std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::size(pvVar5);
      if (sVar6 < sVar3) {
        fmt::v5::basic_string_view<char>::basic_string_view
                  ((basic_string_view<char> *)&i_1,"Superfluous parameters to callee {}.");
        pSVar4 = signature(this);
        fmt::v5::format<flow::Signature>(&local_170,_i_1,pSVar4);
        std::__cxx11::string::operator=((string *)native,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        this_local._7_1_ = 0;
      }
      else {
        e = 0;
        _givenType = ParamList::size((ParamList *)errorMessage_local);
        for (; e != _givenType; e = e + 1) {
          pSVar4 = signature(this);
          pvVar5 = Signature::args(pSVar4);
          pvVar7 = std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::operator[]
                             (pvVar5,e);
          local_194 = *pvVar7;
          pvVar8 = ParamList::values((ParamList *)errorMessage_local);
          this_00 = std::
                    vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                    ::operator[](pvVar8,e);
          pEVar9 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                   operator->(this_00);
          local_198 = (*(pEVar9->super_ASTNode)._vptr_ASTNode[3])();
          if (local_198 != local_194) {
            fmt::v5::basic_string_view<char>::basic_string_view
                      (&local_1c8,"Type mismatch in positional parameter {}, callee {}.");
            i_2 = e + 1;
            pSVar4 = signature(this);
            format_str_02.size_ = (size_t)&i_2;
            format_str_02.data_ = (char *)local_1c8.size_;
            fmt::v5::format<unsigned_long,flow::Signature>
                      (&local_1b8,(v5 *)local_1c8.data_,format_str_02,(unsigned_long *)pSVar4,in_R9)
            ;
            std::__cxx11::string::operator=((string *)native,(string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1b8);
            this_local._7_1_ = 0;
            goto LAB_0017a200;
          }
        }
        e_1 = ParamList::size((ParamList *)errorMessage_local);
        pSVar4 = signature(this);
        pvVar5 = Signature::args(pSVar4);
        defaultValue_1 =
             (DefaultValue *)
             std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::size(pvVar5);
        for (; (DefaultValue *)e_1 != defaultValue_1; e_1 = e_1 + 1) {
          local_1e8 = NativeCallback::getDefaultParamAt_abi_cxx11_(local_30,e_1);
          bVar1 = std::
                  holds_alternative<std::monostate,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                            (local_1e8);
          if (bVar1) {
            fmt::v5::basic_string_view<char>::basic_string_view
                      (&local_218,
                       "No default value provided for positional parameter {}, callee {}.");
            name = (string *)(e_1 + 1);
            pSVar4 = signature(this);
            format_str_03.size_ = (size_t)&name;
            format_str_03.data_ = (char *)local_218.size_;
            fmt::v5::format<unsigned_long,flow::Signature>
                      (&local_208,(v5 *)local_218.data_,format_str_03,(unsigned_long *)pSVar4,in_R9)
            ;
            std::__cxx11::string::operator=((string *)native,(string *)&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            this_local._7_1_ = 0;
            goto LAB_0017a200;
          }
          psVar10 = NativeCallback::getParamNameAt_abi_cxx11_(local_30,e_1);
          pSVar4 = NativeCallback::signature(local_30);
          pvVar5 = Signature::args(pSVar4);
          pvVar7 = std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::operator[]
                             (pvVar5,e_1);
          completeDefaultValue((ParamList *)errorMessage_local,*pvVar7,local_1e8,psVar10);
        }
        Signature::Signature
                  ((Signature *)
                   &argTypes.
                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        psVar10 = Symbol::name_abi_cxx11_(&this->super_Symbol);
        Signature::setName((Signature *)
                           &argTypes.
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar10);
        pSVar4 = signature(this);
        rt = Signature::returnType(pSVar4);
        Signature::setReturnType
                  ((Signature *)
                   &argTypes.
                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,rt);
        std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::vector
                  ((vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)&__range3);
        pvVar8 = ParamList::values((ParamList *)errorMessage_local);
        __end3 = std::
                 vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                 ::begin(pvVar8);
        arg = (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
              std::
              vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
              ::end(pvVar8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
                                           *)&arg), bVar1) {
          local_2a8 = __gnu_cxx::
                      __normal_iterator<const_std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
                      ::operator*(&__end3);
          pEVar9 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                   operator->(local_2a8);
          local_2ac = (*(pEVar9->super_ASTNode)._vptr_ASTNode[3])();
          std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::push_back
                    ((vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)&__range3,
                     &local_2ac);
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
          ::operator++(&__end3);
        }
        Signature::setArgs((Signature *)
                           &argTypes.
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)
                           &__range3);
        pSVar4 = signature(this);
        bVar1 = Signature::operator!=
                          ((Signature *)
                           &argTypes.
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pSVar4);
        if (bVar1) {
          fmt::v5::basic_string_view<char>::basic_string_view
                    (&local_2e0,
                     "Callee parameter type signature mismatch: {} passed, but {} expected.");
          pSVar4 = signature(this);
          format_str_04.size_ =
               (size_t)&argTypes.
                        super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          format_str_04.data_ = (char *)local_2e0.size_;
          fmt::v5::format<flow::Signature,flow::Signature>
                    (&local_2d0,(v5 *)local_2e0.data_,format_str_04,pSVar4,in_R9);
          std::__cxx11::string::operator=((string *)native,(string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
        }
        this_local._7_1_ = !bVar1;
        local_14c = 1;
        std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::~vector
                  ((vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)&__range3);
        Signature::~Signature
                  ((Signature *)
                   &argTypes.
                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
LAB_0017a200:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CallableSym::tryMatch(ParamList& params, std::string* errorMessage) const {
  // printf("CallableSym(%s).tryMatch()\n", name().c_str());

  const NativeCallback* native = nativeCallback();

  if (params.empty() && (!native || native->signature().args().empty()))
    return true;

  if (params.isNamed()) {
    if (!native->parametersNamed()) {
      *errorMessage = fmt::format(
          "Callee \"{}\" invoked with named parameters, but no names provided "
          "by runtime.",
          name());
      return false;
    }

    int argc = signature().args().size();
    for (int i = 0; i != argc; ++i) {
      const auto& paramName = native->getParamNameAt(i);
      if (!params.contains(paramName)) {
        const NativeCallback::DefaultValue& defaultValue =
            native->getDefaultParamAt(i);
        if (std::holds_alternative<std::monostate>(defaultValue)) {
          *errorMessage = fmt::format(
              "Callee \"{}\" invoked without required named parameter \"{}\".",
              name(), paramName);
          return false;
        }
        LiteralType type = signature().args()[i];
        completeDefaultValue(params, type, defaultValue, paramName);
      }
    }

    // reorder params (and detect superfluous params)
    std::vector<std::string> superfluous;
    params.reorder(native, &superfluous);

    if (!superfluous.empty()) {
      std::string t;
      for (const auto& s : superfluous) {
        if (!t.empty()) t += ", ";
        t += "\"";
        t += s;
        t += "\"";
      }
      *errorMessage = fmt::format(
          "Superfluous arguments passed to callee \"{}\": {}.", name(), t);
      return false;
    }

    return true;
  } else  // verify params positional
  {
    if (params.size() > signature().args().size()) {
      *errorMessage = fmt::format("Superfluous parameters to callee {}.", signature());
      return false;
    }

    for (size_t i = 0, e = params.size(); i != e; ++i) {
      LiteralType expectedType = signature().args()[i];
      LiteralType givenType = params.values()[i]->getType();
      if (givenType != expectedType) {
        *errorMessage = fmt::format(
            "Type mismatch in positional parameter {}, callee {}.",
            i + 1, signature());
        return false;
      }
    }

    for (size_t i = params.size(), e = signature().args().size(); i != e; ++i) {
      const NativeCallback::DefaultValue& defaultValue = native->getDefaultParamAt(i);
      if (std::holds_alternative<std::monostate>(defaultValue)) {
        *errorMessage = fmt::format(
            "No default value provided for positional parameter {}, callee {}.",
            i + 1, signature());
        return false;
      }

      const std::string& name = native->getParamNameAt(i);
      LiteralType type = native->signature().args()[i];
      completeDefaultValue(params, type, defaultValue, name);
    }

    Signature sig;
    sig.setName(this->name());
    sig.setReturnType(signature().returnType());  // XXX cheetah
    std::vector<LiteralType> argTypes;
    for (const auto& arg : params.values()) {
      argTypes.push_back(arg->getType());
    }
    sig.setArgs(argTypes);

    if (sig != signature()) {
      *errorMessage = fmt::format(
          "Callee parameter type signature mismatch: {} passed, but {} expected.",
          sig, signature());
      return false;
    }

    return true;
  }
}